

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_draw_command * nk__draw_list_begin(nk_draw_list *canvas,nk_buffer *buffer)

{
  if (buffer == (nk_buffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x2434,
                  "const struct nk_draw_command *nk__draw_list_begin(const struct nk_draw_list *, const struct nk_buffer *)"
                 );
  }
  if ((buffer->size != 0) && (canvas->cmd_count != 0)) {
    return (nk_draw_command *)
           (((buffer->memory).size - canvas->cmd_offset) + (long)(buffer->memory).ptr);
  }
  return (nk_draw_command *)0x0;
}

Assistant:

NK_API const struct nk_draw_command*
nk__draw_list_begin(const struct nk_draw_list *canvas, const struct nk_buffer *buffer)
{
    nk_byte *memory;
    nk_size offset;
    const struct nk_draw_command *cmd;

    NK_ASSERT(buffer);
    if (!buffer || !buffer->size || !canvas->cmd_count)
        return 0;

    memory = (nk_byte*)buffer->memory.ptr;
    offset = buffer->memory.size - canvas->cmd_offset;
    cmd = nk_ptr_add(const struct nk_draw_command, memory, offset);
    return cmd;
}